

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

void icu_63::number::impl::PatternParser::patternInfoToProperties
               (DecimalFormatProperties *properties,ParsedPatternInfo *patternInfo,
               IgnoreRounding _ignoreRounding,UErrorCode *status)

{
  DecimalQuantity *this;
  short sVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  double dVar12;
  UnicodeString rawPaddingString;
  UnicodeString posSuffix;
  UnicodeString posPrefix;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if (_ignoreRounding == IGNORE_ROUNDING_NEVER) {
    cVar11 = '\0';
  }
  else if (_ignoreRounding == IGNORE_ROUNDING_IF_CURRENCY) {
    cVar11 = (patternInfo->positive).hasCurrencySign;
  }
  else {
    cVar11 = '\x01';
  }
  uVar2 = (patternInfo->positive).groupingSizes;
  uVar7 = (int)uVar2 >> 0x10;
  iVar9 = (int)(short)uVar2;
  if (uVar7 == 0xffffffff) {
    iVar9 = -1;
  }
  properties->groupingSize = iVar9;
  properties->groupingUsed = uVar7 != 0xffffffff;
  properties->secondaryGroupingSize = -(uint)((~uVar2 & 0xffff00000000) == 0) | uVar7;
  if (((patternInfo->positive).integerTotal == 0) && (0 < (patternInfo->positive).fractionTotal)) {
    iVar4 = uprv_max_63(1,(patternInfo->positive).fractionNumerals);
    iVar10 = 0;
  }
  else {
    iVar9 = (patternInfo->positive).integerNumerals;
    iVar4 = (patternInfo->positive).fractionNumerals;
    iVar10 = 1;
    if (iVar4 != 0 || iVar9 != 0) {
      iVar10 = iVar9;
    }
  }
  iVar9 = (patternInfo->positive).integerAtSigns;
  if (iVar9 < 1) {
    this = &(patternInfo->positive).rounding;
    bVar3 = DecimalQuantity::isZero(this);
    if (bVar3) {
      iVar9 = -1;
      iVar5 = -1;
      iVar8 = -1;
      if (cVar11 == '\0') {
        iVar5 = (patternInfo->positive).fractionTotal;
        iVar8 = iVar4;
      }
      properties->minimumFractionDigits = iVar8;
      properties->maximumFractionDigits = iVar5;
      properties->roundingIncrement = 0.0;
      properties->minimumSignificantDigits = -1;
    }
    else {
      if (cVar11 == '\0') {
        properties->minimumFractionDigits = iVar4;
        properties->maximumFractionDigits = (patternInfo->positive).fractionTotal;
        dVar12 = DecimalQuantity::toDouble(this);
      }
      else {
        properties->minimumFractionDigits = -1;
        properties->maximumFractionDigits = -1;
        dVar12 = 0.0;
      }
      properties->roundingIncrement = dVar12;
      properties->minimumSignificantDigits = -1;
      iVar9 = -1;
    }
  }
  else {
    properties->minimumFractionDigits = -1;
    properties->maximumFractionDigits = -1;
    properties->roundingIncrement = 0.0;
    properties->minimumSignificantDigits = iVar9;
    iVar9 = iVar9 + (patternInfo->positive).integerTrailingHashSigns;
  }
  properties->maximumSignificantDigits = iVar9;
  properties->decimalSeparatorAlwaysShown =
       (bool)((patternInfo->positive).fractionTotal == 0 & (patternInfo->positive).hasDecimal);
  iVar9 = (patternInfo->positive).exponentZeros;
  if (iVar9 < 1) {
    properties->exponentSignAlwaysShown = false;
    properties->minimumExponentDigits = -1;
    properties->minimumIntegerDigits = iVar10;
LAB_00276aa5:
    iVar5 = -1;
  }
  else {
    properties->exponentSignAlwaysShown = (patternInfo->positive).exponentHasPlusSign;
    properties->minimumExponentDigits = iVar9;
    if ((patternInfo->positive).integerAtSigns != 0) {
      properties->minimumIntegerDigits = 1;
      goto LAB_00276aa5;
    }
    properties->minimumIntegerDigits = (patternInfo->positive).integerNumerals;
    iVar5 = (patternInfo->positive).integerTotal;
  }
  properties->maximumIntegerDigits = iVar5;
  (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
            (&local_b0,patternInfo,0x100);
  (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
            (&local_f0,patternInfo,0);
  if ((patternInfo->positive).hasPadding != true) {
    properties->formatWidth = -1;
    UnicodeString::setToBogus(&properties->padString);
    (properties->padPosition).fNull = true;
    goto LAB_00276c27;
  }
  iVar9 = (patternInfo->positive).widthExceptAffixes;
  iVar5 = AffixUtils::estimateLength(&local_b0,status);
  iVar6 = AffixUtils::estimateLength(&local_f0,status);
  properties->formatWidth = iVar5 + iVar9 + iVar6;
  (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
            (&local_130,patternInfo,0x400);
  if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
    local_130.fUnion.fFields.fLength = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (local_130.fUnion.fFields.fLength == 2) {
    if (((int)local_130.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_130.fUnion.fFields.fArray = local_130.fUnion.fStackFields.fBuffer;
    }
    if (*local_130.fUnion.fFields.fArray != L'\'') goto LAB_00276be0;
    UnicodeString::unBogus(&properties->padString);
    sVar1 = (properties->padString).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (properties->padString).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&properties->padString,0,iVar5,L"\'",0,-1);
  }
  else if (local_130.fUnion.fFields.fLength == 1) {
LAB_00276be0:
    UnicodeString::operator=(&properties->padString,&local_130);
  }
  else {
    UnicodeString::UnicodeString(&local_70,&local_130,1,local_130.fUnion.fFields.fLength + -2);
    UnicodeString::moveFrom(&properties->padString,&local_70);
    UnicodeString::~UnicodeString(&local_70);
  }
  (properties->padPosition).fValue = (patternInfo->positive).paddingLocation;
  (properties->padPosition).fNull = false;
  UnicodeString::~UnicodeString(&local_130);
LAB_00276c27:
  UnicodeString::operator=(&properties->positivePrefixPattern,&local_b0);
  UnicodeString::operator=(&properties->positiveSuffixPattern,&local_f0);
  if (patternInfo->fHasNegativeSubpattern == true) {
    (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
              (&local_130,patternInfo,0x300);
    UnicodeString::moveFrom(&properties->negativePrefixPattern,&local_130);
    UnicodeString::~UnicodeString(&local_130);
    (*(patternInfo->super_AffixPatternProvider)._vptr_AffixPatternProvider[4])
              (&local_130,patternInfo,0x200);
    UnicodeString::moveFrom(&properties->negativeSuffixPattern,&local_130);
    UnicodeString::~UnicodeString(&local_130);
  }
  else {
    UnicodeString::setToBogus(&properties->negativePrefixPattern);
    UnicodeString::setToBogus(&properties->negativeSuffixPattern);
  }
  if ((patternInfo->positive).hasPercentSign == true) {
    properties->magnitudeMultiplier = 2;
  }
  else if ((patternInfo->positive).hasPerMilleSign == true) {
    properties->magnitudeMultiplier = 3;
  }
  else {
    properties->magnitudeMultiplier = 0;
  }
  UnicodeString::~UnicodeString(&local_f0);
  UnicodeString::~UnicodeString(&local_b0);
  return;
}

Assistant:

void
PatternParser::patternInfoToProperties(DecimalFormatProperties& properties, ParsedPatternInfo& patternInfo,
                                       IgnoreRounding _ignoreRounding, UErrorCode& status) {
    // Translate from PatternParseResult to Properties.
    // Note that most data from "negative" is ignored per the specification of DecimalFormat.

    const ParsedSubpatternInfo& positive = patternInfo.positive;

    bool ignoreRounding;
    if (_ignoreRounding == IGNORE_ROUNDING_NEVER) {
        ignoreRounding = false;
    } else if (_ignoreRounding == IGNORE_ROUNDING_IF_CURRENCY) {
        ignoreRounding = positive.hasCurrencySign;
    } else {
        U_ASSERT(_ignoreRounding == IGNORE_ROUNDING_ALWAYS);
        ignoreRounding = true;
    }

    // Grouping settings
    auto grouping1 = static_cast<int16_t> (positive.groupingSizes & 0xffff);
    auto grouping2 = static_cast<int16_t> ((positive.groupingSizes >> 16) & 0xffff);
    auto grouping3 = static_cast<int16_t> ((positive.groupingSizes >> 32) & 0xffff);
    if (grouping2 != -1) {
        properties.groupingSize = grouping1;
        properties.groupingUsed = true;
    } else {
        properties.groupingSize = -1;
        properties.groupingUsed = false;
    }
    if (grouping3 != -1) {
        properties.secondaryGroupingSize = grouping2;
    } else {
        properties.secondaryGroupingSize = -1;
    }

    // For backwards compatibility, require that the pattern emit at least one min digit.
    int minInt, minFrac;
    if (positive.integerTotal == 0 && positive.fractionTotal > 0) {
        // patterns like ".##"
        minInt = 0;
        minFrac = uprv_max(1, positive.fractionNumerals);
    } else if (positive.integerNumerals == 0 && positive.fractionNumerals == 0) {
        // patterns like "#.##"
        minInt = 1;
        minFrac = 0;
    } else {
        minInt = positive.integerNumerals;
        minFrac = positive.fractionNumerals;
    }

    // Rounding settings
    // Don't set basic rounding when there is a currency sign; defer to CurrencyUsage
    if (positive.integerAtSigns > 0) {
        properties.minimumFractionDigits = -1;
        properties.maximumFractionDigits = -1;
        properties.roundingIncrement = 0.0;
        properties.minimumSignificantDigits = positive.integerAtSigns;
        properties.maximumSignificantDigits = positive.integerAtSigns + positive.integerTrailingHashSigns;
    } else if (!positive.rounding.isZero()) {
        if (!ignoreRounding) {
            properties.minimumFractionDigits = minFrac;
            properties.maximumFractionDigits = positive.fractionTotal;
            properties.roundingIncrement = positive.rounding.toDouble();
        } else {
            properties.minimumFractionDigits = -1;
            properties.maximumFractionDigits = -1;
            properties.roundingIncrement = 0.0;
        }
        properties.minimumSignificantDigits = -1;
        properties.maximumSignificantDigits = -1;
    } else {
        if (!ignoreRounding) {
            properties.minimumFractionDigits = minFrac;
            properties.maximumFractionDigits = positive.fractionTotal;
            properties.roundingIncrement = 0.0;
        } else {
            properties.minimumFractionDigits = -1;
            properties.maximumFractionDigits = -1;
            properties.roundingIncrement = 0.0;
        }
        properties.minimumSignificantDigits = -1;
        properties.maximumSignificantDigits = -1;
    }

    // If the pattern ends with a '.' then force the decimal point.
    if (positive.hasDecimal && positive.fractionTotal == 0) {
        properties.decimalSeparatorAlwaysShown = true;
    } else {
        properties.decimalSeparatorAlwaysShown = false;
    }

    // Scientific notation settings
    if (positive.exponentZeros > 0) {
        properties.exponentSignAlwaysShown = positive.exponentHasPlusSign;
        properties.minimumExponentDigits = positive.exponentZeros;
        if (positive.integerAtSigns == 0) {
            // patterns without '@' can define max integer digits, used for engineering notation
            properties.minimumIntegerDigits = positive.integerNumerals;
            properties.maximumIntegerDigits = positive.integerTotal;
        } else {
            // patterns with '@' cannot define max integer digits
            properties.minimumIntegerDigits = 1;
            properties.maximumIntegerDigits = -1;
        }
    } else {
        properties.exponentSignAlwaysShown = false;
        properties.minimumExponentDigits = -1;
        properties.minimumIntegerDigits = minInt;
        properties.maximumIntegerDigits = -1;
    }

    // Compute the affix patterns (required for both padding and affixes)
    UnicodeString posPrefix = patternInfo.getString(AffixPatternProvider::AFFIX_PREFIX);
    UnicodeString posSuffix = patternInfo.getString(0);

    // Padding settings
    if (positive.hasPadding) {
        // The width of the positive prefix and suffix templates are included in the padding
        int paddingWidth = positive.widthExceptAffixes +
                           AffixUtils::estimateLength(posPrefix, status) +
                           AffixUtils::estimateLength(posSuffix, status);
        properties.formatWidth = paddingWidth;
        UnicodeString rawPaddingString = patternInfo.getString(AffixPatternProvider::AFFIX_PADDING);
        if (rawPaddingString.length() == 1) {
            properties.padString = rawPaddingString;
        } else if (rawPaddingString.length() == 2) {
            if (rawPaddingString.charAt(0) == u'\'') {
                properties.padString.setTo(u"'", -1);
            } else {
                properties.padString = rawPaddingString;
            }
        } else {
            properties.padString = UnicodeString(rawPaddingString, 1, rawPaddingString.length() - 2);
        }
        properties.padPosition = positive.paddingLocation;
    } else {
        properties.formatWidth = -1;
        properties.padString.setToBogus();
        properties.padPosition.nullify();
    }

    // Set the affixes
    // Always call the setter, even if the prefixes are empty, especially in the case of the
    // negative prefix pattern, to prevent default values from overriding the pattern.
    properties.positivePrefixPattern = posPrefix;
    properties.positiveSuffixPattern = posSuffix;
    if (patternInfo.fHasNegativeSubpattern) {
        properties.negativePrefixPattern = patternInfo.getString(
                AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN | AffixPatternProvider::AFFIX_PREFIX);
        properties.negativeSuffixPattern = patternInfo.getString(
                AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN);
    } else {
        properties.negativePrefixPattern.setToBogus();
        properties.negativeSuffixPattern.setToBogus();
    }

    // Set the magnitude multiplier
    if (positive.hasPercentSign) {
        properties.magnitudeMultiplier = 2;
    } else if (positive.hasPerMilleSign) {
        properties.magnitudeMultiplier = 3;
    } else {
        properties.magnitudeMultiplier = 0;
    }
}